

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>
* __thiscall
fmt::v10::
make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,void*,std::__cxx11::string,unsigned_short>
          (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>
           *__return_storage_ptr__,v10 *this,void **args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          unsigned_short *args_2)

{
  longlong lVar1;
  size_t sVar2;
  unsigned_short *args_local_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_1;
  void **args_local;
  undefined1 local_119;
  char *local_118;
  size_t local_110;
  undefined1 local_103;
  undefined1 local_102;
  undefined1 local_101;
  bool formattable_1;
  bool formattable_pointer_1;
  void **ppvStack_100;
  bool formattable_char_1;
  char *local_f8 [3];
  void **local_e0;
  undefined1 *local_d8;
  basic_string_view<char> local_d0;
  char **local_c0;
  basic_string_view<char> local_b8;
  undefined1 local_a4;
  undefined1 local_a3;
  undefined1 local_a2;
  undefined1 local_a1;
  bool formattable;
  bool formattable_pointer;
  v10 *pvStack_a0;
  bool formattable_char;
  undefined1 local_98 [8];
  size_t local_90;
  longlong local_88;
  undefined1 *local_80;
  longlong local_78;
  undefined1 *local_70;
  bool formattable_2;
  bool formattable_pointer_2;
  bool formattable_char_2;
  longlong local_38;
  size_t local_30;
  
  local_a1 = 1;
  local_a2 = 1;
  local_a3 = 1;
  lVar1 = *(longlong *)this;
  local_80 = &local_a4;
  local_70 = local_98;
  local_101 = 1;
  local_102 = 1;
  local_103 = 1;
  local_d8 = &local_119;
  ppvStack_100 = args;
  local_e0 = args;
  pvStack_a0 = this;
  local_88 = lVar1;
  local_78 = lVar1;
  local_d0 = detail::to_string_view<char,std::char_traits<char>,std::allocator<char>>
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
  local_118 = local_d0.data_;
  local_110 = local_d0.size_;
  local_b8.data_ = local_d0.data_;
  local_b8.size_ = local_d0.size_;
  local_c0 = local_f8;
  local_f8[0] = basic_string_view<char>::data(&local_b8);
  sVar2 = basic_string_view<char>::size(&local_b8);
  local_38._0_4_ = (uint)*(ushort *)args_1;
  (__return_storage_ptr__->data_).args_[0].field_0.long_long_value = lVar1;
  (__return_storage_ptr__->data_).args_[0].field_0.string.size = local_90;
  (__return_storage_ptr__->data_).args_[1].field_0.string.data = local_f8[0];
  (__return_storage_ptr__->data_).args_[1].field_0.string.size = sVar2;
  (__return_storage_ptr__->data_).args_[2].field_0.long_long_value = local_38;
  (__return_storage_ptr__->data_).args_[2].field_0.string.size = local_30;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto make_format_args(T&... args)
    -> format_arg_store<Context, remove_cvref_t<T>...> {
  return {args...};
}